

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O2

void Godunov::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_forces,MultiFab *a_umac,MultiFab *a_vmac,
               MultiFab *a_wmac,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,
               BCRec *d_bcrec,Geometry *geom,Real l_dt,bool use_ppm,bool use_forces_in_trans)

{
  Real *p;
  Geometry geom_00;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec_00;
  int iVar6;
  long lVar7;
  uint uVar8;
  Geometry *pGVar9;
  int iVar10;
  undefined8 *puVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  byte bVar17;
  undefined1 in_stack_fffffffffffff7b0 [64];
  undefined8 in_stack_fffffffffffff7f0;
  Array4<double> *in_stack_fffffffffffff7f8;
  Array4<double> *in_stack_fffffffffffff800;
  Array4<const_double> *in_stack_fffffffffffff808;
  Array4<const_double> *in_stack_fffffffffffff810;
  Array4<const_double> *in_stack_fffffffffffff818;
  Array4<const_double> *in_stack_fffffffffffff820;
  Array4<double> *in_stack_fffffffffffff828;
  Array4<double> *in_stack_fffffffffffff830;
  Array4<double> *in_stack_fffffffffffff838;
  Array4<double> *in_stack_fffffffffffff840;
  Array4<double> *in_stack_fffffffffffff848;
  Array4<double> *in_stack_fffffffffffff850;
  Array4<const_double> *in_stack_fffffffffffff858;
  Box *in_stack_fffffffffffff860;
  Real *in_stack_fffffffffffff868;
  BCRec *in_stack_fffffffffffff870;
  Array4<const_double> local_748;
  Box result;
  Box local_6d4;
  ulong local_6b8;
  ulong local_6b0;
  Box local_6a4;
  Box local_688;
  Box local_66c;
  Array4<double> local_650;
  Array4<double> local_610;
  Array4<double> local_5d0;
  Array4<double> local_590;
  Array4<double> local_550;
  Array4<double> local_510;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  Real *local_4b8;
  Box *local_4b0;
  FabArray<amrex::FArrayBox> *local_4a8;
  FabArray<amrex::FArrayBox> *local_4a0;
  FabArray<amrex::FArrayBox> *local_498;
  FabArray<amrex::FArrayBox> *local_490;
  FabArray<amrex::FArrayBox> *local_488;
  long local_480;
  double *local_478;
  Array4<double> local_470;
  Array4<double> local_430;
  Array4<double> local_3f0;
  Array4<const_double> local_3b0;
  Array4<const_double> local_370;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  MFIter mfi;
  Box local_1cc;
  Box local_1b0;
  Box local_194;
  FArrayBox scratch;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  bVar17 = 0;
  local_4a0 = &a_forces->super_FabArray<amrex::FArrayBox>;
  local_498 = &a_umac->super_FabArray<amrex::FArrayBox>;
  local_490 = &a_vmac->super_FabArray<amrex::FArrayBox>;
  local_488 = &a_wmac->super_FabArray<amrex::FArrayBox>;
  amrex::FArrayBox::FArrayBox(&scratch);
  local_4a8 = &a_vel->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_vel,true);
  local_4b0 = &geom->domain;
  local_4b8 = (geom->super_CoordSys).dx;
  local_4d0 = h_bcrec;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_6d4,&mfi);
    result.smallend.vect[2] = local_6d4.smallend.vect[2] + -1;
    result.bigend.vect[0] = local_6d4.bigend.vect[0] + 1;
    result.smallend.vect[1] = local_6d4.smallend.vect[1] + -1;
    result.smallend.vect[0] = local_6d4.smallend.vect[0] + -1;
    result.bigend.vect[1] = local_6d4.bigend.vect[1] + 1;
    result.bigend.vect[2] = local_6d4.bigend.vect[2] + 1;
    amrex::MFIter::nodaltilebox(&local_194,&mfi,0);
    amrex::MFIter::nodaltilebox(&local_1b0,&mfi,1);
    amrex::MFIter::nodaltilebox(&local_1cc,&mfi,2);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,local_498,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_b0,local_490,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_488,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_330,local_4a8,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_130,local_4a0,&mfi);
    amrex::FArrayBox::resize((FArrayBox *)&scratch.super_BaseFab<double>,&result,0x27,(Arena *)0x0);
    local_510.p = amrex::BaseFab<double>::dataPtr(&scratch.super_BaseFab<double>,0);
    h_bcrec_00 = local_4d0;
    iVar16 = local_6d4.bigend.vect[2];
    iVar5 = local_6d4.bigend.vect[1];
    iVar4 = local_6d4.smallend.vect[2];
    iVar3 = local_6d4.smallend.vect[1];
    iVar2 = local_6d4.smallend.vect[0];
    local_650.jstride = ((long)result.bigend.vect[0] - (long)result.smallend.vect[0]) + 1;
    local_650.kstride =
         (((long)result.bigend.vect[1] + 1) - (long)result.smallend.vect[1]) * local_650.jstride;
    local_650.nstride =
         (((long)result.bigend.vect[2] + 1) - (long)result.smallend.vect[2]) * local_650.kstride;
    local_510.begin.x = result.smallend.vect[0];
    local_510.begin.y = result.smallend.vect[1];
    local_510.begin.z = result.smallend.vect[2];
    local_650.end._0_8_ =
         (ulong)(result.bigend.vect[0] + 1) | (long)result.bigend.vect[1] + 1 << 0x20;
    local_650.end.z = (int)((long)result.bigend.vect[2] + 1);
    local_550.p = local_510.p + local_650.nstride * 3;
    local_550.begin.x = result.smallend.vect[0];
    local_550.begin.y = result.smallend.vect[1];
    local_550.begin.z = result.smallend.vect[2];
    local_590.p = local_550.p + local_650.nstride * 3;
    local_590.begin.x = result.smallend.vect[0];
    local_590.begin.y = result.smallend.vect[1];
    local_590.begin.z = result.smallend.vect[2];
    local_5d0.p = local_590.p + local_650.nstride * 3;
    local_5d0.begin.x = result.smallend.vect[0];
    local_5d0.begin.y = result.smallend.vect[1];
    local_5d0.begin.z = result.smallend.vect[2];
    local_610.p = local_5d0.p + local_650.nstride * 3;
    local_610.begin.x = result.smallend.vect[0];
    local_610.begin.y = result.smallend.vect[1];
    local_610.begin.z = result.smallend.vect[2];
    local_650.p = local_610.p + local_650.nstride * 3;
    local_650.begin.x = result.smallend.vect[0];
    local_650.begin.y = result.smallend.vect[1];
    local_650.begin.z = result.smallend.vect[2];
    local_3f0.p = local_650.p + local_650.nstride * 3;
    local_6b8 = (ulong)(uint)local_6d4.bigend.vect[0];
    iVar12 = local_6d4.smallend.vect[1] + -1;
    iVar14 = local_6d4.smallend.vect[2] + -1;
    iVar15 = local_6d4.bigend.vect[0] - (local_6d4.btype.itype | 0xfffffffe);
    iVar10 = local_6d4.bigend.vect[1] + 2;
    local_3f0.jstride = (Long)(iVar15 - local_6d4.smallend.vect[0]);
    local_3f0.kstride = local_3f0.jstride * (iVar10 - iVar12);
    local_430.end.z = local_6d4.bigend.vect[2] + 2;
    local_3f0.nstride = local_3f0.kstride * (local_430.end.z - iVar14);
    local_3f0.begin.y = iVar12;
    local_3f0.begin.x = local_6d4.smallend.vect[0];
    local_3f0.end.y = iVar10;
    local_3f0.end.x = iVar15;
    local_430.p = local_3f0.p + local_3f0.nstride;
    iVar6 = local_6d4.bigend.vect[1] - (local_6d4.btype.itype >> 1 | 0xfffffffe);
    iVar13 = local_6d4.bigend.vect[0] + 2;
    local_430.end.y = iVar6;
    local_430.end.x = iVar13;
    local_470.end.y = iVar10;
    local_470.end.x = iVar13;
    uVar8 = local_6d4.smallend.vect[0] - 1;
    local_6b0 = (ulong)uVar8;
    local_470.jstride = (Long)(int)(iVar13 - uVar8);
    local_430.kstride = (iVar6 - local_6d4.smallend.vect[1]) * local_470.jstride;
    local_430.nstride = local_430.kstride * (local_430.end.z - iVar14);
    local_430.begin.y = local_6d4.smallend.vect[1];
    local_430.begin.x = uVar8;
    local_478 = local_430.p + local_430.nstride;
    iVar13 = local_6d4.bigend.vect[2] - (local_6d4.btype.itype >> 2 | 0xfffffffe);
    local_470.kstride = (iVar10 - iVar12) * local_470.jstride;
    local_480 = (iVar13 - local_6d4.smallend.vect[2]) * local_470.kstride;
    local_470.begin.y = iVar12;
    local_470.begin.x = uVar8;
    local_470.begin.z = local_6d4.smallend.vect[2];
    local_650.ncomp = 3;
    local_470.ncomp = 1;
    local_610.jstride = local_650.jstride;
    local_610.kstride = local_650.kstride;
    local_610.nstride = local_650.nstride;
    local_610.end._0_8_ = local_650.end._0_8_;
    local_610.end.z = local_650.end.z;
    local_610.ncomp = local_650.ncomp;
    local_5d0.jstride = local_650.jstride;
    local_5d0.kstride = local_650.kstride;
    local_5d0.nstride = local_650.nstride;
    local_5d0.end._0_8_ = local_650.end._0_8_;
    local_5d0.end.z = local_650.end.z;
    local_5d0.ncomp = local_650.ncomp;
    local_590.jstride = local_650.jstride;
    local_590.kstride = local_650.kstride;
    local_590.nstride = local_650.nstride;
    local_590.end._0_8_ = local_650.end._0_8_;
    local_590.end.z = local_650.end.z;
    local_590.ncomp = local_650.ncomp;
    local_550.jstride = local_650.jstride;
    local_550.kstride = local_650.kstride;
    local_550.nstride = local_650.nstride;
    local_550.end._0_8_ = local_650.end._0_8_;
    local_550.end.z = local_650.end.z;
    local_550.ncomp = local_650.ncomp;
    local_510.jstride = local_650.jstride;
    local_510.kstride = local_650.kstride;
    local_510.nstride = local_650.nstride;
    local_510.end._0_8_ = local_650.end._0_8_;
    local_510.end.z = local_650.end.z;
    local_510.ncomp = local_650.ncomp;
    local_470.p = local_478;
    local_470.nstride = local_480;
    local_470.end.z = iVar13;
    local_430.jstride = local_470.jstride;
    local_430.begin.z = iVar14;
    local_430.ncomp = local_470.ncomp;
    local_3f0.begin.z = iVar14;
    local_3f0.end.z = local_430.end.z;
    local_3f0.ncomp = local_470.ncomp;
    if (use_ppm) {
      pGVar9 = geom;
      puVar11 = (undefined8 *)&stack0xfffffffffffff7b0;
      for (lVar7 = 0x19; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar11 = *(undefined8 *)&pGVar9->super_CoordSys;
        pGVar9 = (Geometry *)((long)pGVar9 + (ulong)bVar17 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
      }
      geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff7f0;
      geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff7b0._0_4_;
      geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff7b0._4_4_;
      geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff7b0._8_8_;
      geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff7b0._16_8_;
      geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff7b0._24_8_;
      geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff7b0._32_8_;
      geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff7b0._40_8_;
      geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff7b0._48_8_;
      geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff7b0._56_8_;
      geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff7f8;
      geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff800;
      geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff808;
      geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff810;
      geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff818;
      geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff820;
      geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff828;
      geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff830;
      geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff838;
      geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff840;
      geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff848;
      geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff850;
      geom_00._168_8_ = in_stack_fffffffffffff858;
      geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff860;
      geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff868;
      geom_00.domain._20_8_ = in_stack_fffffffffffff870;
      PPM::PredictVelOnFaces
                (&result,&local_510,&local_590,&local_610,&local_550,&local_5d0,&local_650,
                 &local_330,&local_330,geom_00,l_dt,d_bcrec);
      local_66c.bigend.vect[0] = iVar15 + -1;
      local_688.bigend.vect[2] = iVar16 + 1;
      iVar16 = (int)local_6b8 + 1;
    }
    else {
      local_748.p = (double *)CONCAT44(iVar12,local_6d4.smallend.vect[0]);
      local_4c0 = (ulong)(iVar15 - 1U);
      iVar10 = local_6d4.bigend.vect[1] + 1;
      uVar8 = local_6d4.bigend.vect[2] + 1;
      local_748.jstride = CONCAT44(iVar15 - 1U,iVar14);
      local_748.kstride = CONCAT44(uVar8,iVar10);
      local_748.nstride = local_748.nstride & 0xffffffff00000000;
      PLM::PredictVelOnXFace
                ((Box *)&local_748,3,&local_510,&local_550,&local_330,&local_330,geom,l_dt,local_4d0
                 ,d_bcrec);
      uVar1 = (undefined4)local_6b0;
      local_748.p = (double *)CONCAT44(iVar3,uVar1);
      iVar16 = (int)local_6b8;
      local_748.jstride = CONCAT44(iVar16 + 1,iVar14);
      local_748.kstride = CONCAT44(uVar8,iVar6 + -1);
      local_748.nstride = local_748.nstride & 0xffffffff00000000;
      local_4c8 = (ulong)uVar8;
      PLM::PredictVelOnYFace
                ((Box *)&local_748,3,&local_590,&local_5d0,&local_330,&local_330,geom,l_dt,
                 h_bcrec_00,d_bcrec);
      local_748.p = (double *)CONCAT44(iVar12,uVar1);
      iVar16 = iVar16 + 1;
      local_748.jstride = CONCAT44(iVar16,iVar4);
      local_748.kstride = CONCAT44(iVar13 + -1,iVar10);
      local_748.nstride = local_748.nstride & 0xffffffff00000000;
      PLM::PredictVelOnZFace
                ((Box *)&local_748,3,&local_610,&local_650,&local_330,&local_330,geom,l_dt,
                 h_bcrec_00,d_bcrec);
      local_688.bigend.vect[2] = (int)local_4c8;
      local_66c.bigend.vect[0] = (int)local_4c0;
    }
    in_stack_fffffffffffff860 = local_4b0;
    local_6a4.bigend.vect[1] = iVar5 + 1;
    local_688.bigend.vect[1] = iVar6 + -1;
    local_6a4.bigend.vect[2] = iVar13 + -1;
    p = local_478 + local_480;
    local_66c.smallend.vect[0] = iVar2;
    local_6a4.smallend.vect[0] = (int)local_6b0;
    local_688.smallend.vect[1] = iVar3;
    local_66c.btype.itype = 0;
    local_688.btype.itype = 0;
    local_748.p = local_510.p;
    local_748.jstride = local_510.jstride;
    local_748.kstride = local_510.kstride;
    local_748.nstride = local_510.nstride;
    local_748.begin.z = local_510.begin.z;
    local_748.begin.x = local_510.begin.x;
    local_748.begin.y = local_510.begin.y;
    local_748.end.z = local_510.end.z;
    local_748.end.x = local_510.end.x;
    local_748.end.y = local_510.end.y;
    local_748.ncomp = local_510.ncomp;
    local_370.p = local_590.p;
    local_370.jstride = local_590.jstride;
    local_370.kstride = local_590.kstride;
    local_370.nstride = local_590.nstride;
    local_370.begin.z = local_590.begin.z;
    local_370.begin.x = local_590.begin.x;
    local_370.begin.y = local_590.begin.y;
    local_370.end.z = local_590.end.z;
    local_370.end.x = local_590.end.x;
    local_370.end.y = local_590.end.y;
    local_370.ncomp = local_590.ncomp;
    local_3b0.p = local_610.p;
    local_3b0.jstride = local_610.jstride;
    local_3b0.kstride = local_610.kstride;
    local_3b0.nstride = local_610.nstride;
    local_3b0.begin.z = local_610.begin.z;
    local_3b0.begin.x = local_610.begin.x;
    local_3b0.begin.y = local_610.begin.y;
    local_3b0.end.z = local_610.end.z;
    local_3b0.end.x = local_610.end.x;
    local_3b0.end.y = local_610.end.y;
    local_3b0.ncomp = local_610.ncomp;
    local_270.p = local_550.p;
    local_270.jstride = local_550.jstride;
    local_270.kstride = local_550.kstride;
    local_270.nstride = local_550.nstride;
    local_270.begin.z = local_550.begin.z;
    local_270.begin.x = local_550.begin.x;
    local_270.begin.y = local_550.begin.y;
    local_270.end.z = local_550.end.z;
    local_270.end.x = local_550.end.x;
    local_270.end.y = local_550.end.y;
    local_270.ncomp = local_550.ncomp;
    local_2b0.p = local_5d0.p;
    local_2b0.jstride = local_5d0.jstride;
    local_2b0.kstride = local_5d0.kstride;
    local_2b0.nstride = local_5d0.nstride;
    local_2b0.begin.z = local_5d0.begin.z;
    local_2b0.begin.x = local_5d0.begin.x;
    local_2b0.begin.y = local_5d0.begin.y;
    local_2b0.end.z = local_5d0.end.z;
    local_2b0.end.x = local_5d0.end.x;
    local_2b0.end.y = local_5d0.end.y;
    local_2b0.ncomp = local_5d0.ncomp;
    local_2f0.p = local_650.p;
    local_2f0.jstride = local_650.jstride;
    local_2f0.kstride = local_650.kstride;
    local_2f0.nstride = local_650.nstride;
    local_2f0.begin.z = local_650.begin.z;
    local_2f0.begin.x = local_650.begin.x;
    local_2f0.begin.y = local_650.begin.y;
    local_2f0.end.z = local_650.end.z;
    local_2f0.end.x = local_650.end.x;
    local_2f0.end.y = local_650.end.y;
    local_2f0.ncomp = local_650.ncomp;
    local_6a4.btype.itype = 0;
    local_6a4.smallend.vect[1] = iVar12;
    local_6a4.bigend.vect[0] = iVar16;
    local_688.smallend.vect[0] = local_6a4.smallend.vect[0];
    local_688.smallend.vect[2] = iVar14;
    local_688.bigend.vect[0] = iVar16;
    local_66c.smallend.vect[1] = iVar12;
    local_66c.smallend.vect[2] = iVar14;
    local_66c.bigend.vect[1] = local_6a4.bigend.vect[1];
    local_66c.bigend.vect[2] = local_688.bigend.vect[2];
    ComputeAdvectiveVel(&local_66c,&local_688,&local_6a4,&local_3f0,&local_430,&local_470,&local_748
                        ,&local_370,&local_3b0,&local_270,&local_2b0,&local_2f0,&local_330,
                        &local_130,local_4b0,l_dt,d_bcrec,use_forces_in_trans);
    local_748.p = local_3f0.p;
    local_748.jstride = local_3f0.jstride;
    local_748.kstride = local_3f0.kstride;
    local_748.nstride = local_3f0.nstride;
    local_748.begin.z = local_3f0.begin.z;
    local_748.begin.x = local_3f0.begin.x;
    local_748.begin.y = local_3f0.begin.y;
    local_748.end.z = local_3f0.end.z;
    local_748.end.x = local_3f0.end.x;
    local_748.end.y = local_3f0.end.y;
    local_748.ncomp = local_3f0.ncomp;
    local_370.p = local_430.p;
    local_370.jstride = local_430.jstride;
    local_370.kstride = local_430.kstride;
    local_370.nstride = local_430.nstride;
    local_370.begin.z = local_430.begin.z;
    local_370.begin.x = local_430.begin.x;
    local_370.begin.y = local_430.begin.y;
    local_370.end.z = local_430.end.z;
    local_370.end.x = local_430.end.x;
    local_370.end.y = local_430.end.y;
    local_370.ncomp = local_430.ncomp;
    local_3b0.p = local_470.p;
    local_3b0.jstride = local_470.jstride;
    local_3b0.kstride = local_470.kstride;
    local_3b0.nstride = local_470.nstride;
    local_3b0.begin.z = local_470.begin.z;
    local_3b0.begin.x = local_470.begin.x;
    local_3b0.begin.y = local_470.begin.y;
    local_3b0.end.z = local_470.end.z;
    local_3b0.end.x = local_470.end.x;
    local_3b0.end.y = local_470.end.y;
    local_3b0.ncomp = local_470.ncomp;
    in_stack_fffffffffffff858 = &local_130;
    in_stack_fffffffffffff850 = &local_650;
    in_stack_fffffffffffff848 = &local_5d0;
    in_stack_fffffffffffff840 = &local_550;
    in_stack_fffffffffffff838 = &local_610;
    in_stack_fffffffffffff830 = &local_590;
    in_stack_fffffffffffff828 = &local_510;
    in_stack_fffffffffffff820 = &local_3b0;
    in_stack_fffffffffffff818 = &local_370;
    in_stack_fffffffffffff810 = &local_748;
    in_stack_fffffffffffff808 = &local_330;
    in_stack_fffffffffffff800 = &local_f0;
    in_stack_fffffffffffff7f8 = &local_b0;
    in_stack_fffffffffffff7f0 = 0x37f228;
    in_stack_fffffffffffff868 = local_4b8;
    in_stack_fffffffffffff870 = d_bcrec;
    ExtrapVelToFacesOnBox
              (&local_6d4,3,&local_194,&local_1b0,&local_1cc,&local_70,in_stack_fffffffffffff7f8,
               in_stack_fffffffffffff800,in_stack_fffffffffffff808,in_stack_fffffffffffff810,
               in_stack_fffffffffffff818,in_stack_fffffffffffff820,in_stack_fffffffffffff828,
               in_stack_fffffffffffff830,in_stack_fffffffffffff838,in_stack_fffffffffffff840,
               in_stack_fffffffffffff848,in_stack_fffffffffffff850,in_stack_fffffffffffff858,
               in_stack_fffffffffffff860,local_4b8,l_dt,d_bcrec,use_forces_in_trans,p);
    amrex::Gpu::Device::streamSynchronize();
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::BaseFab<double>::~BaseFab(&scratch.super_BaseFab<double>);
  return;
}

Assistant:

void
Godunov::ExtrapVelToFaces ( MultiFab const& a_vel,
                            MultiFab const& a_forces,
                            MultiFab& a_umac,
                            MultiFab& a_vmac,
                            MultiFab& a_wmac,
                            const Vector<BCRec> & h_bcrec,
                const        BCRec  * d_bcrec,
                            const Geometry& geom, Real l_dt,
                            bool use_ppm, bool use_forces_in_trans)
{
    Box const& domain = geom.Domain();
    const Real* dx    = geom.CellSize();

    const int ncomp = AMREX_SPACEDIM;
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox scratch;
        for (MFIter mfi(a_vel,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Box const& bxg1 = amrex::grow(bx,1);

            Box const& xbx = mfi.nodaltilebox(0);
            Box const& ybx = mfi.nodaltilebox(1);
            Box const& zbx = mfi.nodaltilebox(2);

            Array4<Real> const& umac = a_umac.array(mfi);
            Array4<Real> const& vmac = a_vmac.array(mfi);
            Array4<Real> const& wmac = a_wmac.array(mfi);

            Array4<Real const> const& vel = a_vel.const_array(mfi);
            Array4<Real const> const& f   = a_forces.const_array(mfi);

            scratch.resize(bxg1, (ncomp*4 + 1)*AMREX_SPACEDIM);
            Real* p = scratch.dataPtr();

            Array4<Real> Imx = makeArray4(p,bxg1,ncomp);
            p +=         Imx.size();
            Array4<Real> Ipx = makeArray4(p,bxg1,ncomp);
            p +=         Ipx.size();
            Array4<Real> Imy = makeArray4(p,bxg1,ncomp);
            p +=         Imy.size();
            Array4<Real> Ipy = makeArray4(p,bxg1,ncomp);
            p +=         Ipy.size();
            Array4<Real> Imz = makeArray4(p,bxg1,ncomp);
            p +=         Imz.size();
            Array4<Real> Ipz = makeArray4(p,bxg1,ncomp);
            p +=         Ipz.size();
            Array4<Real> u_ad = makeArray4(p,Box(bx).grow(1,1).grow(2,1).surroundingNodes(0),1);
            p +=         u_ad.size();
            Array4<Real> v_ad = makeArray4(p,Box(bx).grow(0,1).grow(2,1).surroundingNodes(1),1);
            p +=         v_ad.size();
            Array4<Real> w_ad = makeArray4(p,Box(bx).grow(0,1).grow(1,1).surroundingNodes(2),1);
            p +=         w_ad.size();

            if (use_ppm)
            {
                PPM::PredictVelOnFaces( bxg1,
                                        Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                        vel, vel,
                                        geom, l_dt, d_bcrec);
            }
            else
            {
                PLM::PredictVelOnXFace( Box(u_ad), AMREX_SPACEDIM, Imx, Ipx, vel, vel,
                                         geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnYFace( Box(v_ad), AMREX_SPACEDIM, Imy, Ipy, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnZFace( Box(w_ad), AMREX_SPACEDIM, Imz, Ipz, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
            }

            ComputeAdvectiveVel( Box(u_ad), Box(v_ad), Box(w_ad),
                                 u_ad, v_ad, w_ad,
                                 Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                 vel, f, domain, l_dt, d_bcrec, use_forces_in_trans);

            ExtrapVelToFacesOnBox( bx, ncomp,
                                   xbx, ybx, zbx,
                                   umac, vmac, wmac, vel,
                                   u_ad, v_ad, w_ad,
                                   Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                   f, domain, dx, l_dt, d_bcrec, use_forces_in_trans, p);

            Gpu::streamSynchronize();  // otherwise we might be using too much memory
        }
    }
}